

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O1

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenTableBuilders
          (LobsterGenerator *this,StructDef *struct_def,string *code_ptr)

{
  size_type *psVar1;
  BaseType BVar2;
  FieldDef *pFVar3;
  pointer ppFVar4;
  Value *type;
  long *plVar5;
  undefined8 *puVar6;
  StructDef *pSVar7;
  size_t t;
  size_t t_00;
  ulong *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer ppFVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer ppFVar12;
  ulong uVar13;
  undefined8 uVar14;
  Type vector_type;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  string local_2b0;
  _Alloc_hider local_290;
  StructDef *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_280;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  string local_250;
  LobsterGenerator *local_230;
  string local_228;
  string *local_208;
  string local_200;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  long lStack_188;
  long *local_180;
  undefined8 local_178;
  long local_170;
  undefined8 uStack_168;
  StructDef *local_160;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  pointer local_38;
  
  local_230 = this;
  local_208 = code_ptr;
  local_160 = struct_def;
  EscapeKeyword(&local_2b0,this,(string *)struct_def);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,0x366e52);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_2c0 = *puVar8;
    lStack_2b8 = plVar5[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar8;
    local_2d0 = (ulong *)*plVar5;
  }
  local_2c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar9) {
    aStack_280._M_allocated_capacity = paVar9->_M_allocated_capacity;
    aStack_280._8_8_ = puVar6[3];
    local_290._M_p = (pointer)&aStack_280;
  }
  else {
    aStack_280._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_290._M_p = (pointer)*puVar6;
  }
  local_288 = (StructDef *)puVar6[1];
  *puVar6 = paVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &aStack_280) {
    operator_delete(local_290._M_p,aStack_280._M_allocated_capacity + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>
            (&local_2b0,
             (long)(local_160->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_160->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,0x37b74c);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_2c0 = *puVar8;
    lStack_2b8 = plVar5[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar8;
    local_2d0 = (ulong *)*plVar5;
  }
  local_2c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar9) {
    aStack_280._M_allocated_capacity = paVar9->_M_allocated_capacity;
    aStack_280._8_8_ = puVar6[3];
    local_290._M_p = (pointer)&aStack_280;
  }
  else {
    aStack_280._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_290._M_p = (pointer)*puVar6;
  }
  local_288 = (StructDef *)puVar6[1];
  *puVar6 = paVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &aStack_280) {
    operator_delete(local_290._M_p,(ulong)(aStack_280._M_allocated_capacity + 1));
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  ppFVar10 = (local_160->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar10 !=
      (local_160->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar9 = &local_250.field_2;
    pSVar7 = local_160;
    ppFVar12 = ppFVar10;
    do {
      pFVar3 = *ppFVar12;
      if (pFVar3->deprecated == false) {
        ppFVar4 = (pSVar7->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_38 = ppFVar10;
        EscapeKeyword(&local_f8,local_230,(string *)pFVar3);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x37b78c);
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_170 = *plVar5;
          uStack_168 = puVar6[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar5;
          local_180 = (long *)*puVar6;
        }
        local_178 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
        local_1e0 = &local_1d0;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_1d0 = *puVar8;
          lStack_1c8 = plVar5[3];
        }
        else {
          local_1d0 = *puVar8;
          local_1e0 = (ulong *)*plVar5;
        }
        local_1d8 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        EscapeKeyword(&local_118,local_230,(string *)pFVar3);
        uVar13 = 0xf;
        if (local_1e0 != &local_1d0) {
          uVar13 = local_1d0;
        }
        if (uVar13 < local_118._M_string_length + local_1d8) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            uVar14 = local_118.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_118._M_string_length + local_1d8) goto LAB_002a545c;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_1e0);
        }
        else {
LAB_002a545c:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1e0,(ulong)local_118._M_dataplus._M_p);
        }
        local_1c0 = &local_1b0;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_1b0 = *plVar5;
          uStack_1a8 = puVar6[3];
        }
        else {
          local_1b0 = *plVar5;
          local_1c0 = (long *)*puVar6;
        }
        local_1b8 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_1a0 = &local_190;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_190 = *puVar8;
          lStack_188 = plVar5[3];
        }
        else {
          local_190 = *puVar8;
          local_1a0 = (ulong *)*plVar5;
        }
        local_198 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        type = &pFVar3->value;
        LobsterType_abi_cxx11_(&local_b8,local_230,&type->type);
        uVar13 = 0xf;
        if (local_1a0 != &local_190) {
          uVar13 = local_190;
        }
        if (uVar13 < local_b8._M_string_length + local_198) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            uVar14 = local_b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_b8._M_string_length + local_198) goto LAB_002a55c2;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_1a0);
        }
        else {
LAB_002a55c2:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1a0,(ulong)local_b8._M_dataplus._M_p);
        }
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        psVar1 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_200.field_2._M_allocated_capacity = *psVar1;
          local_200.field_2._8_8_ = puVar6[3];
        }
        else {
          local_200.field_2._M_allocated_capacity = *psVar1;
          local_200._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_200._M_string_length = puVar6[1];
        *puVar6 = psVar1;
        puVar6[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
        puVar8 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_250.field_2._M_allocated_capacity = *puVar8;
          local_250.field_2._8_8_ = plVar5[3];
          local_250._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_250.field_2._M_allocated_capacity = *puVar8;
          local_250._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_250._M_string_length = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        GenMethod_abi_cxx11_(&local_138,local_230,&type->type);
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar9) {
          uVar14 = local_250.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_138._M_string_length + local_250._M_string_length) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            uVar14 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_138._M_string_length + local_250._M_string_length)
          goto LAB_002a5712;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_138,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
        }
        else {
LAB_002a5712:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_250,(ulong)local_138._M_dataplus._M_p);
        }
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        psVar1 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_228.field_2._M_allocated_capacity = *psVar1;
          local_228.field_2._8_8_ = puVar6[3];
        }
        else {
          local_228.field_2._M_allocated_capacity = *psVar1;
          local_228._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_228._M_string_length = puVar6[1];
        *puVar6 = psVar1;
        puVar6[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
        local_270 = &local_260;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_260 = *puVar8;
          lStack_258 = plVar5[3];
        }
        else {
          local_260 = *puVar8;
          local_270 = (ulong *)*plVar5;
        }
        local_268 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        NumToString<long>(&local_d8,(long)ppFVar10 - (long)ppFVar4 >> 3);
        uVar13 = 0xf;
        if (local_270 != &local_260) {
          uVar13 = local_260;
        }
        if (uVar13 < local_d8._M_string_length + local_268) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            uVar14 = local_d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_d8._M_string_length + local_268) goto LAB_002a5857;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_270);
        }
        else {
LAB_002a5857:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_d8._M_dataplus._M_p);
        }
        psVar1 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_2b0.field_2._M_allocated_capacity = *psVar1;
          local_2b0.field_2._8_8_ = puVar6[3];
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *psVar1;
          local_2b0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2b0._M_string_length = puVar6[1];
        *puVar6 = psVar1;
        puVar6[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
        local_2d0 = &local_2c0;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_2c0 = *puVar8;
          lStack_2b8 = plVar5[3];
        }
        else {
          local_2c0 = *puVar8;
          local_2d0 = (ulong *)*plVar5;
        }
        local_2c8 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        EscapeKeyword(&local_158,local_230,(string *)pFVar3);
        uVar13 = 0xf;
        if (local_2d0 != &local_2c0) {
          uVar13 = local_2c0;
        }
        if (uVar13 < local_158._M_string_length + local_2c8) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            uVar14 = local_158.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_158._M_string_length + local_2c8) goto LAB_002a5983;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_2d0);
        }
        else {
LAB_002a5983:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2d0,(ulong)local_158._M_dataplus._M_p);
        }
        local_290._M_p = (pointer)&aStack_280;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 == paVar11) {
          aStack_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
          aStack_280._8_8_ = puVar6[3];
        }
        else {
          aStack_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_290._M_p = (pointer)*puVar6;
        }
        local_288 = (StructDef *)puVar6[1];
        *puVar6 = paVar11;
        puVar6[1] = 0;
        paVar11->_M_local_buf[0] = '\0';
        std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_p != &aStack_280) {
          operator_delete(local_290._M_p,(ulong)(aStack_280._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,local_2c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar9) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,local_190 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (((type->type).base_type - BASE_TYPE_UTYPE < 0xc) && (pFVar3->presence != kOptional)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_290,", ",&(pFVar3->value).constant);
          std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_p != &aStack_280) {
            operator_delete(local_290._M_p,(ulong)(aStack_280._M_allocated_capacity + 1));
          }
        }
        std::__cxx11::string::append((char *)local_208);
        pSVar7 = local_160;
        ppFVar10 = local_38;
      }
      ppFVar12 = ppFVar12 + 1;
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar12 !=
             (pSVar7->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)local_208);
  ppFVar10 = (local_160->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar10 !=
      (local_160->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar7 = local_160;
    do {
      paVar9 = &local_2b0.field_2;
      pFVar3 = *ppFVar10;
      if ((pFVar3->deprecated == false) &&
         ((BVar2 = (pFVar3->value).type.base_type, BVar2 == BASE_TYPE_VECTOR64 ||
          (BVar2 == BASE_TYPE_VECTOR)))) {
        EscapeKeyword(&local_228,local_230,(string *)pSVar7);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x37b380);
        local_270 = &local_260;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_260 = *puVar8;
          lStack_258 = plVar5[3];
        }
        else {
          local_260 = *puVar8;
          local_270 = (ulong *)*plVar5;
        }
        local_268 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
        puVar8 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_2b0.field_2._M_allocated_capacity = *puVar8;
          local_2b0.field_2._8_8_ = plVar5[3];
          local_2b0._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *puVar8;
          local_2b0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2b0._M_string_length = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        EscapeKeyword(&local_200,local_230,(string *)pFVar3);
        ConvertCase(&local_250,&local_200,kUpperCamel,kSnake);
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar9) {
          uVar14 = local_2b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_250._M_string_length + local_2b0._M_string_length) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            uVar14 = local_250.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_250._M_string_length + local_2b0._M_string_length)
          goto LAB_002a5e9d;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_250,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
        }
        else {
LAB_002a5e9d:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2b0,(ulong)local_250._M_dataplus._M_p);
        }
        local_2d0 = &local_2c0;
        puVar8 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar8) {
          local_2c0 = *puVar8;
          lStack_2b8 = puVar6[3];
        }
        else {
          local_2c0 = *puVar8;
          local_2d0 = (ulong *)*puVar6;
        }
        local_2c8 = puVar6[1];
        *puVar6 = puVar8;
        puVar6[1] = 0;
        *(undefined1 *)puVar8 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar11) {
          aStack_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
          aStack_280._8_8_ = plVar5[3];
          local_290._M_p = (pointer)&aStack_280;
        }
        else {
          aStack_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_290._M_p = (pointer)*plVar5;
        }
        local_288 = (StructDef *)plVar5[1];
        *plVar5 = (long)paVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_p != &aStack_280) {
          operator_delete(local_290._M_p,aStack_280._M_allocated_capacity + 1);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,local_2c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar9) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        local_288 = (pFVar3->value).type.struct_def;
        aStack_280._M_allocated_capacity = (size_type)(pFVar3->value).type.enum_def;
        local_290._M_p._4_4_ = 0;
        local_290._M_p._0_4_ = (pFVar3->value).type.element;
        aStack_280._8_2_ = (pFVar3->value).type.fixed_length;
        t = InlineAlignment((Type *)&local_290);
        t_00 = InlineSize((Type *)&local_290);
        NumToString<unsigned_long>(&local_228,t_00);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
        local_270 = &local_260;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_260 = *puVar8;
          lStack_258 = plVar5[3];
        }
        else {
          local_260 = *puVar8;
          local_270 = (ulong *)*plVar5;
        }
        local_268 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        NumToString<unsigned_long>(&local_250,t);
        uVar13 = 0xf;
        if (local_270 != &local_260) {
          uVar13 = local_260;
        }
        if (uVar13 < local_250._M_string_length + local_268) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            uVar14 = local_250.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_250._M_string_length + local_268) goto LAB_002a6157;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_270);
        }
        else {
LAB_002a6157:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_250._M_dataplus._M_p);
        }
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        psVar1 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_2b0.field_2._M_allocated_capacity = *psVar1;
          local_2b0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *psVar1;
          local_2b0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2b0._M_string_length = puVar6[1];
        *puVar6 = psVar1;
        puVar6[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
        local_2d0 = &local_2c0;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_2c0 = *puVar8;
          lStack_2b8 = plVar5[3];
        }
        else {
          local_2c0 = *puVar8;
          local_2d0 = (ulong *)*plVar5;
        }
        local_2c8 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_208,(ulong)local_2d0);
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,local_2c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (((BaseType)local_290._M_p != BASE_TYPE_STRUCT) || (local_288->fixed == false)) {
          EscapeKeyword(&local_b8,local_230,(string *)local_160);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x37b380);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          puVar8 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_118.field_2._M_allocated_capacity = *puVar8;
            local_118.field_2._8_8_ = plVar5[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = *puVar8;
            local_118._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_118._M_string_length = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          puVar8 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_f8.field_2._M_allocated_capacity = *puVar8;
            local_f8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *puVar8;
            local_f8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_f8._M_string_length = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          EscapeKeyword(&local_d8,local_230,(string *)pFVar3);
          ConvertCase(&local_138,&local_d8,kUpperCamel,kSnake);
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar14 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_138._M_string_length + local_f8._M_string_length) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              uVar14 = local_138.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_138._M_string_length + local_f8._M_string_length)
            goto LAB_002a6474;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_138,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
          }
          else {
LAB_002a6474:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)local_138._M_dataplus._M_p);
          }
          local_180 = &local_170;
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_170 = *plVar5;
            uStack_168 = puVar6[3];
          }
          else {
            local_170 = *plVar5;
            local_180 = (long *)*puVar6;
          }
          local_178 = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)plVar5 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
          local_1e0 = &local_1d0;
          puVar8 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar8) {
            local_1d0 = *puVar8;
            lStack_1c8 = plVar5[3];
          }
          else {
            local_1d0 = *puVar8;
            local_1e0 = (ulong *)*plVar5;
          }
          local_1d8 = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          LobsterType_abi_cxx11_(&local_158,local_230,(Type *)&local_290);
          uVar13 = 0xf;
          if (local_1e0 != &local_1d0) {
            uVar13 = local_1d0;
          }
          if (uVar13 < local_158._M_string_length + local_1d8) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              uVar14 = local_158.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_158._M_string_length + local_1d8) goto LAB_002a65d3;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_1e0)
            ;
          }
          else {
LAB_002a65d3:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1e0,(ulong)local_158._M_dataplus._M_p);
          }
          local_1c0 = &local_1b0;
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_1b0 = *plVar5;
            uStack_1a8 = puVar6[3];
          }
          else {
            local_1b0 = *plVar5;
            local_1c0 = (long *)*puVar6;
          }
          local_1b8 = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)plVar5 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c0);
          local_1a0 = &local_190;
          puVar8 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar8) {
            local_190 = *puVar8;
            lStack_188 = plVar5[3];
          }
          else {
            local_190 = *puVar8;
            local_1a0 = (ulong *)*plVar5;
          }
          local_198 = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          NumToString<unsigned_long>(&local_58,t_00);
          uVar13 = 0xf;
          if (local_1a0 != &local_190) {
            uVar13 = local_190;
          }
          if (uVar13 < local_58._M_string_length + local_198) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              uVar14 = local_58.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_58._M_string_length + local_198) goto LAB_002a6737;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_1a0);
          }
          else {
LAB_002a6737:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1a0,(ulong)local_58._M_dataplus._M_p);
          }
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          psVar1 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_200.field_2._M_allocated_capacity = *psVar1;
            local_200.field_2._8_8_ = puVar6[3];
          }
          else {
            local_200.field_2._M_allocated_capacity = *psVar1;
            local_200._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_200._M_string_length = puVar6[1];
          *puVar6 = psVar1;
          puVar6[1] = 0;
          *(undefined1 *)psVar1 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
          puVar8 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_250.field_2._M_allocated_capacity = *puVar8;
            local_250.field_2._8_8_ = plVar5[3];
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          }
          else {
            local_250.field_2._M_allocated_capacity = *puVar8;
            local_250._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_250._M_string_length = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          NumToString<unsigned_long>(&local_78,t);
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            uVar14 = local_250.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_78._M_string_length + local_250._M_string_length) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              uVar14 = local_78.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_78._M_string_length + local_250._M_string_length)
            goto LAB_002a688d;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_78,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
          }
          else {
LAB_002a688d:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_250,(ulong)local_78._M_dataplus._M_p);
          }
          psVar1 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_228.field_2._M_allocated_capacity = *psVar1;
            local_228.field_2._8_8_ = puVar6[3];
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          }
          else {
            local_228.field_2._M_allocated_capacity = *psVar1;
            local_228._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_228._M_string_length = puVar6[1];
          *puVar6 = psVar1;
          puVar6[1] = 0;
          *(undefined1 *)psVar1 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
          local_270 = &local_260;
          puVar8 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar8) {
            local_260 = *puVar8;
            lStack_258 = plVar5[3];
          }
          else {
            local_260 = *puVar8;
            local_270 = (ulong *)*plVar5;
          }
          local_268 = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          GenMethod_abi_cxx11_(&local_98,local_230,(Type *)&local_290);
          uVar13 = 0xf;
          if (local_270 != &local_260) {
            uVar13 = local_260;
          }
          if (uVar13 < local_98._M_string_length + local_268) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              uVar14 = local_98.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_98._M_string_length + local_268) goto LAB_002a69ca;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_270);
          }
          else {
LAB_002a69ca:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_270,(ulong)local_98._M_dataplus._M_p);
          }
          psVar1 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_2b0.field_2._M_allocated_capacity = *psVar1;
            local_2b0.field_2._8_8_ = puVar6[3];
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *psVar1;
            local_2b0._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_2b0._M_string_length = puVar6[1];
          *puVar6 = psVar1;
          puVar6[1] = 0;
          *(undefined1 *)psVar1 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
          puVar8 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar8) {
            local_2c0 = *puVar8;
            lStack_2b8 = plVar5[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0 = *puVar8;
            local_2d0 = (ulong *)*plVar5;
          }
          local_2c8 = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_208,(ulong)local_2d0);
          if (local_2d0 != &local_2c0) {
            operator_delete(local_2d0,local_2c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if (local_1a0 != &local_190) {
            operator_delete(local_1a0,local_190 + 1);
          }
          if (local_1c0 != &local_1b0) {
            operator_delete(local_1c0,local_1b0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if (local_1e0 != &local_1d0) {
            operator_delete(local_1e0,local_1d0 + 1);
          }
          if (local_180 != &local_170) {
            operator_delete(local_180,local_170 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)local_208);
        pSVar7 = local_160;
      }
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 !=
             (pSVar7->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenTableBuilders(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "struct " + NormalizedName(struct_def) +
            "Builder:\n    b_:flatbuffers.builder\n";
    code += "    def start():\n        b_.StartObject(" +
            NumToString(struct_def.fields.vec.size()) +
            ")\n        return this\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto offset = it - struct_def.fields.vec.begin();
      code += "    def add_" + NormalizedName(field) + "(" +
              NormalizedName(field) + ":" + LobsterType(field.value.type) +
              "):\n        b_.Prepend" + GenMethod(field.value.type) + "Slot(" +
              NumToString(offset) + ", " + NormalizedName(field);
      if (IsScalar(field.value.type.base_type) && !field.IsOptional())
        code += ", " + field.value.constant;
      code += ")\n        return this\n";
    }
    code += "    def end():\n        return b_.EndObject()\n\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (IsVector(field.value.type)) {
        code += "def " + NormalizedName(struct_def) + "Start" +
                ConvertCase(NormalizedName(field), Case::kUpperCamel) +
                "Vector(b_:flatbuffers.builder, n_:int):\n    b_.StartVector(";
        auto vector_type = field.value.type.VectorType();
        auto alignment = InlineAlignment(vector_type);
        auto elem_size = InlineSize(vector_type);
        code +=
            NumToString(elem_size) + ", n_, " + NumToString(alignment) + ")\n";
        if (vector_type.base_type != BASE_TYPE_STRUCT ||
            !vector_type.struct_def->fixed) {
          code += "def " + NormalizedName(struct_def) + "Create" +
                  ConvertCase(NormalizedName(field), Case::kUpperCamel) +
                  "Vector(b_:flatbuffers.builder, v_:[" +
                  LobsterType(vector_type) + "]):\n    b_.StartVector(" +
                  NumToString(elem_size) + ", v_.length, " +
                  NumToString(alignment) + ")\n    reverse(v_) e_: b_.Prepend" +
                  GenMethod(vector_type) +
                  "(e_)\n    return b_.EndVector(v_.length)\n";
        }
        code += "\n";
      }
    }
  }